

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.hpp
# Opt level: O0

Cycles __thiscall
Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::MegaBoy>::perform_bus_operation
          (Cartridge<Atari2600::Cartridge::MegaBoy> *this,BusOperation operation,uint16_t address,
          uint8_t *value)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ssize_t sVar4;
  uint uVar5;
  uint *__n;
  uint *puVar6;
  void *__buf;
  uint16_t decodedAddress_1;
  uint16_t decodedAddress;
  Cycles local_48;
  Cycles local_40;
  WrappedInt<Cycles> local_38;
  int local_30;
  byte local_29;
  int cycles_run_for;
  uint8_t returnValue;
  uint8_t *value_local;
  uint16_t address_local;
  Cartridge<Atari2600::Cartridge::MegaBoy> *pCStack_18;
  BusOperation operation_local;
  Cartridge<Atari2600::Cartridge::MegaBoy> *this_local;
  
  local_29 = 0xff;
  local_30 = 3;
  _cycles_run_for = (uint *)value;
  value_local._2_2_ = address;
  value_local._4_4_ = operation;
  pCStack_18 = this;
  if (operation == Ready) {
    local_38.length_ = (this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.length_
    ;
    local_30 = TIA::get_cycles_until_horizontal_blank
                         (&(this->super_Bus).tia_,(Cycles)local_38.length_);
  }
  Cycles::Cycles(&local_40,(long)local_30);
  WrappedInt<Cycles>::operator+=
            (&(this->super_Bus).cycles_since_speaker_update_.super_WrappedInt<Cycles>,&local_40);
  Cycles::Cycles(&local_48,(long)local_30);
  WrappedInt<Cycles>::operator+=
            (&(this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>,&local_48);
  Cycles::Cycles((Cycles *)&stack0xffffffffffffffb0,(long)(local_30 / 3));
  WrappedInt<Cycles>::operator+=
            (&(this->super_Bus).cycles_since_6532_update_.super_WrappedInt<Cycles>,
             (Cycles *)&stack0xffffffffffffffb0);
  BusExtender::advance_cycles(&(this->bus_extender_).super_BusExtender,local_30 / 3);
  if (((int)value_local._4_4_ < 4) || (value_local._4_4_ == Write)) {
    __n = _cycles_run_for;
    MegaBoy::perform_bus_operation
              (&this->bus_extender_,value_local._4_4_,value_local._2_2_,(uint8_t *)_cycles_run_for);
    if ((value_local._2_2_ & 0x1280) == 0x80) {
      if ((int)value_local._4_4_ < 5) {
        bVar1 = MOS::MOS6532<Atari2600::PIA>::get_ram
                          (&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>,
                           value_local._2_2_);
        __n = (uint *)(ulong)bVar1;
        local_29 = local_29 & bVar1;
      }
      else {
        __n = (uint *)CONCAT62((int6)((ulong)__n >> 0x10),value_local._2_2_);
        MOS::MOS6532<Atari2600::PIA>::set_ram
                  (&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>,value_local._2_2_,
                   (byte)*_cycles_run_for);
      }
    }
    if ((value_local._2_2_ & 0x1080) == 0) {
      if ((int)value_local._4_4_ < 5) {
        uVar2 = value_local._2_2_ & 0xf;
        uVar5 = (uint)uVar2;
        if (uVar5 < 8) {
          bVar1 = TIA::get_collision_flags(&(this->super_Bus).tia_,(uint)uVar2);
          __n = (uint *)(ulong)bVar1;
          local_29 = local_29 & bVar1;
        }
        else if (uVar5 - 8 < 4) {
          local_29 = 0;
        }
        else if (uVar5 - 0xc < 2) {
          bVar1 = (this->super_Bus).tia_input_value_[(int)(uVar2 - 0xc)];
          __n = (uint *)(ulong)bVar1;
          local_29 = local_29 & bVar1;
        }
      }
      else {
        uVar2 = value_local._2_2_ & 0x3f;
        puVar6 = &switchD_0065e152::switchdataD_00a48714;
        switch(uVar2) {
        case 0:
          Bus::update_video(&this->super_Bus);
          TIA::set_sync(&(this->super_Bus).tia_,(*_cycles_run_for & 2) != 0);
          __n = puVar6;
          break;
        case 1:
          Bus::update_video(&this->super_Bus);
          TIA::set_blank(&(this->super_Bus).tia_,(*_cycles_run_for & 2) != 0);
          __n = puVar6;
          break;
        case 2:
          CPU::MOS6502::
          Processor<(CPU::MOS6502::Personality)1,_Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::MegaBoy>,_true>
          ::set_ready_line(&this->m6502_,true);
          __n = puVar6;
          break;
        case 3:
          Bus::update_video(&this->super_Bus);
          TIA::reset_horizontal_counter(&(this->super_Bus).tia_);
          uVar5 = this->horizontal_counter_resets_ + 1;
          this->horizontal_counter_resets_ = uVar5;
          __n = (uint *)(ulong)uVar5;
          break;
        case 4:
        case 5:
          Bus::update_video(&this->super_Bus);
          TIA::set_player_number_and_size(&(this->super_Bus).tia_,uVar2 - 4,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 6:
        case 7:
          Bus::update_video(&this->super_Bus);
          TIA::set_player_missile_colour(&(this->super_Bus).tia_,uVar2 - 6,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 8:
          Bus::update_video(&this->super_Bus);
          TIA::set_playfield_ball_colour(&(this->super_Bus).tia_,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 9:
          Bus::update_video(&this->super_Bus);
          TIA::set_background_colour(&(this->super_Bus).tia_,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 10:
          Bus::update_video(&this->super_Bus);
          TIA::set_playfield_control_and_ball_size(&(this->super_Bus).tia_,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 0xb:
        case 0xc:
          Bus::update_video(&this->super_Bus);
          TIA::set_player_reflected
                    (&(this->super_Bus).tia_,uVar2 - 0xb,
                     (bool)(((*_cycles_run_for & 8) != 0 ^ 0xffU) & 1));
          __n = puVar6;
          break;
        case 0xd:
        case 0xe:
        case 0xf:
          Bus::update_video(&this->super_Bus);
          __n = (uint *)CONCAT62((int6)((ulong)puVar6 >> 0x10),uVar2 - 0xd);
          TIA::set_playfield(&(this->super_Bus).tia_,uVar2 - 0xd,(byte)*_cycles_run_for);
          break;
        case 0x10:
        case 0x11:
          Bus::update_video(&this->super_Bus);
          TIA::set_player_position(&(this->super_Bus).tia_,uVar2 - 0x10);
          __n = puVar6;
          break;
        case 0x12:
        case 0x13:
          Bus::update_video(&this->super_Bus);
          TIA::set_missile_position(&(this->super_Bus).tia_,uVar2 - 0x12);
          __n = puVar6;
          break;
        case 0x14:
          Bus::update_video(&this->super_Bus);
          TIA::set_ball_position(&(this->super_Bus).tia_);
          __n = puVar6;
          break;
        case 0x15:
        case 0x16:
          Bus::update_audio(&this->super_Bus);
          TIASound::set_control(&(this->super_Bus).tia_sound_,uVar2 - 0x15,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 0x17:
        case 0x18:
          Bus::update_audio(&this->super_Bus);
          TIASound::set_divider(&(this->super_Bus).tia_sound_,uVar2 - 0x17,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 0x19:
        case 0x1a:
          Bus::update_audio(&this->super_Bus);
          TIASound::set_volume(&(this->super_Bus).tia_sound_,uVar2 - 0x19,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 0x1b:
        case 0x1c:
          Bus::update_video(&this->super_Bus);
          TIA::set_player_graphic(&(this->super_Bus).tia_,uVar2 - 0x1b,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 0x1d:
        case 0x1e:
          Bus::update_video(&this->super_Bus);
          TIA::set_missile_enable(&(this->super_Bus).tia_,uVar2 - 0x1d,(*_cycles_run_for & 2) != 0);
          __n = puVar6;
          break;
        case 0x1f:
          Bus::update_video(&this->super_Bus);
          TIA::set_ball_enable(&(this->super_Bus).tia_,(*_cycles_run_for & 2) != 0);
          __n = puVar6;
          break;
        case 0x20:
        case 0x21:
          Bus::update_video(&this->super_Bus);
          TIA::set_player_motion(&(this->super_Bus).tia_,uVar2 - 0x20,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 0x22:
        case 0x23:
          Bus::update_video(&this->super_Bus);
          TIA::set_missile_motion(&(this->super_Bus).tia_,uVar2 - 0x22,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 0x24:
          Bus::update_video(&this->super_Bus);
          TIA::set_ball_motion(&(this->super_Bus).tia_,(byte)*_cycles_run_for);
          __n = puVar6;
          break;
        case 0x25:
        case 0x26:
          TIA::set_player_delay(&(this->super_Bus).tia_,uVar2 - 0x25,(*_cycles_run_for & 1) != 0);
          __n = puVar6;
          break;
        case 0x27:
          TIA::set_ball_delay(&(this->super_Bus).tia_,(*_cycles_run_for & 1) != 0);
          __n = puVar6;
          break;
        case 0x28:
        case 0x29:
          Bus::update_video(&this->super_Bus);
          TIA::set_missile_position_to_player
                    (&(this->super_Bus).tia_,uVar2 - 0x28,(*_cycles_run_for & 2) != 0);
          __n = puVar6;
          break;
        case 0x2a:
          Bus::update_video(&this->super_Bus);
          TIA::move(&(this->super_Bus).tia_);
          __n = puVar6;
          break;
        case 0x2b:
          Bus::update_video(&this->super_Bus);
          TIA::clear_motion(&(this->super_Bus).tia_);
          __n = puVar6;
          break;
        case 0x2c:
          Bus::update_video(&this->super_Bus);
          TIA::clear_collision_flags(&(this->super_Bus).tia_);
          __n = puVar6;
        }
      }
    }
    if ((value_local._2_2_ & 0x1280) == 0x280) {
      Bus::update_6532(&this->super_Bus);
      if ((int)value_local._4_4_ < 5) {
        sVar4 = MOS::MOS6532<Atari2600::PIA>::read
                          (&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>,
                           (uint)value_local._2_2_,__buf,(size_t)__n);
        local_29 = local_29 & (byte)sVar4;
      }
      else {
        MOS::MOS6532<Atari2600::PIA>::write
                  (&(this->super_Bus).mos6532_.super_MOS6532<Atari2600::PIA>,(uint)value_local._2_2_
                   ,(void *)(ulong)(byte)*_cycles_run_for,(size_t)__n);
      }
    }
    if ((int)value_local._4_4_ < 5) {
      *(byte *)_cycles_run_for = (byte)*_cycles_run_for & local_29;
    }
  }
  iVar3 = TIA::get_cycles_until_horizontal_blank
                    (&(this->super_Bus).tia_,
                     (Cycles)(this->super_Bus).cycles_since_video_update_.super_WrappedInt<Cycles>.
                             length_);
  if (iVar3 == 0) {
    CPU::MOS6502::
    Processor<(CPU::MOS6502::Personality)1,_Atari2600::Cartridge::Cartridge<Atari2600::Cartridge::MegaBoy>,_true>
    ::set_ready_line(&this->m6502_,false);
  }
  Cycles::Cycles((Cycles *)&this_local,(long)(local_30 / 3));
  return (Cycles)(WrappedInt<Cycles>)this_local;
}

Assistant:

Cycles perform_bus_operation(CPU::MOS6502::BusOperation operation, uint16_t address, uint8_t *value) {
			uint8_t returnValue = 0xff;
			int cycles_run_for = 3;

			// this occurs as a feedback loop: the 2600 requests ready, then performs the cycles_run_for
			// leap to the end of ready only once ready is signalled because on a 6502 ready doesn't take
			// effect until the next read; therefore it isn't safe to assume that signalling ready immediately
			// skips to the end of the line.
			if(operation == CPU::MOS6502::BusOperation::Ready)
				cycles_run_for = tia_.get_cycles_until_horizontal_blank(cycles_since_video_update_);

			cycles_since_speaker_update_ += Cycles(cycles_run_for);
			cycles_since_video_update_ += Cycles(cycles_run_for);
			cycles_since_6532_update_ += Cycles(cycles_run_for / 3);
			bus_extender_.advance_cycles(cycles_run_for / 3);

			if(isAccessOperation(operation)) {
				// give the cartridge a chance to respond to the bus access
				bus_extender_.perform_bus_operation(operation, address, value);

				// check for a RIOT RAM access
				if((address&0x1280) == 0x80) {
					if(isReadOperation(operation)) {
						returnValue &= mos6532_.get_ram(address);
					} else {
						mos6532_.set_ram(address, *value);
					}
				}

				// check for a TIA access
				if(!(address&0x1080)) {
					if(isReadOperation(operation)) {
						const uint16_t decodedAddress = address & 0xf;
						switch(decodedAddress) {
							case 0x00:		// missile 0 / player collisions
							case 0x01:		// missile 1 / player collisions
							case 0x02:		// player 0 / playfield / ball collisions
							case 0x03:		// player 1 / playfield / ball collisions
							case 0x04:		// missile 0 / playfield / ball collisions
							case 0x05:		// missile 1 / playfield / ball collisions
							case 0x06:		// ball / playfield collisions
							case 0x07:		// player / player, missile / missile collisions
								returnValue &= tia_.get_collision_flags(decodedAddress);
							break;

							case 0x08:
							case 0x09:
							case 0x0a:
							case 0x0b:
								// TODO: pot ports
								returnValue &= 0;
							break;

							case 0x0c:
							case 0x0d:
								returnValue &= tia_input_value_[decodedAddress - 0x0c];
							break;
						}
					} else {
						const uint16_t decodedAddress = address & 0x3f;
						switch(decodedAddress) {
							case 0x00:	update_video(); tia_.set_sync(*value & 0x02);		break;
							case 0x01:	update_video();	tia_.set_blank(*value & 0x02);		break;

							case 0x02:	m6502_.set_ready_line(true);						break;
							case 0x03:
								update_video();
								tia_.reset_horizontal_counter();
								horizontal_counter_resets_++;
							break;
								// TODO: audio will now be out of synchronisation. Fix.

							case 0x04:
							case 0x05:	update_video();	tia_.set_player_number_and_size(decodedAddress - 0x04, *value);	break;
							case 0x06:
							case 0x07:	update_video();	tia_.set_player_missile_colour(decodedAddress - 0x06, *value);		break;
							case 0x08:	update_video();	tia_.set_playfield_ball_colour(*value);								break;
							case 0x09:	update_video();	tia_.set_background_colour(*value);									break;
							case 0x0a:	update_video();	tia_.set_playfield_control_and_ball_size(*value);					break;
							case 0x0b:
							case 0x0c:	update_video();	tia_.set_player_reflected(decodedAddress - 0x0b, !((*value)&8));	break;
							case 0x0d:
							case 0x0e:
							case 0x0f:	update_video();	tia_.set_playfield(decodedAddress - 0x0d, *value);					break;
							case 0x10:
							case 0x11:	update_video(); tia_.set_player_position(decodedAddress - 0x10);					break;
							case 0x12:
							case 0x13:	update_video(); tia_.set_missile_position(decodedAddress - 0x12);					break;
							case 0x14:	update_video();	tia_.set_ball_position();											break;
							case 0x1b:
							case 0x1c:	update_video(); tia_.set_player_graphic(decodedAddress - 0x1b, *value);				break;
							case 0x1d:
							case 0x1e:	update_video(); tia_.set_missile_enable(decodedAddress - 0x1d, (*value)&2);			break;
							case 0x1f:	update_video(); tia_.set_ball_enable((*value)&2);									break;
							case 0x20:
							case 0x21:	update_video(); tia_.set_player_motion(decodedAddress - 0x20, *value);				break;
							case 0x22:
							case 0x23:	update_video(); tia_.set_missile_motion(decodedAddress - 0x22, *value);				break;
							case 0x24:	update_video(); tia_.set_ball_motion(*value);										break;
							case 0x25:
							case 0x26:	tia_.set_player_delay(decodedAddress - 0x25, (*value)&1);							break;
							case 0x27:	tia_.set_ball_delay((*value)&1);													break;
							case 0x28:
							case 0x29:	update_video(); tia_.set_missile_position_to_player(decodedAddress - 0x28, (*value)&2);		break;
							case 0x2a:	update_video(); tia_.move();														break;
							case 0x2b:	update_video(); tia_.clear_motion();												break;
							case 0x2c:	update_video(); tia_.clear_collision_flags();										break;

							case 0x15:
							case 0x16:	update_audio(); tia_sound_.set_control(decodedAddress - 0x15, *value);				break;
							case 0x17:
							case 0x18:	update_audio(); tia_sound_.set_divider(decodedAddress - 0x17, *value);				break;
							case 0x19:
							case 0x1a:	update_audio(); tia_sound_.set_volume(decodedAddress - 0x19, *value);				break;
						}
					}
				}

				// check for a PIA access
				if((address&0x1280) == 0x280) {
					update_6532();
					if(isReadOperation(operation)) {
						returnValue &= mos6532_.read(address);
					} else {
						mos6532_.write(address, *value);
					}
				}

				if(isReadOperation(operation)) {
					*value &= returnValue;
				}
			}

			if(!tia_.get_cycles_until_horizontal_blank(cycles_since_video_update_)) m6502_.set_ready_line(false);

			return Cycles(cycles_run_for / 3);
		}